

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

int m2v_LU_decomp_inplace(m2v *A,int *rp,int *cp)

{
  m2v_base mVar1;
  m2v_base *pmVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint c2;
  ulong uVar13;
  int iVar14;
  uint *puVar15;
  
  if (0 < A->n_row) {
    lVar4 = 0;
    do {
      rp[lVar4] = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 < A->n_row);
  }
  if (0 < A->n_col) {
    lVar4 = 0;
    do {
      cp[lVar4] = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 < A->n_col);
  }
  uVar9 = (ulong)(uint)A->n_col;
  if (A->n_col < 1) {
    uVar13 = 0;
  }
  else {
    lVar4 = 0;
    uVar13 = 0;
    while ((long)uVar13 < (long)A->n_row) {
      uVar10 = (uint)uVar9;
      bVar3 = (long)uVar13 < (long)(int)uVar10;
      if ((long)(int)uVar10 <= (long)uVar13) break;
      pmVar2 = A->e;
      c2 = (uint)uVar13;
      uVar7 = uVar13 & 0xffffffff;
      uVar9 = uVar13;
LAB_00101e9e:
      puVar15 = (uint *)((long)pmVar2 + (uVar9 >> 5) * 4 + lVar4 * A->row_stride);
      uVar11 = uVar13 & 0xffffffff;
      uVar12 = uVar13;
      while( true ) {
        if ((*puVar15 & 1 << ((byte)uVar7 & 0x1f)) != 0) break;
        uVar12 = uVar12 + 1;
        puVar15 = puVar15 + A->row_stride;
        uVar11 = (ulong)((int)uVar11 + 1);
        if ((uint)A->n_row == uVar12) goto code_r0x00101ec9;
      }
      if ((uVar12 & 0xffffffff) != uVar13) {
        iVar14 = rp[uVar12 & 0xffffffff];
        rp[uVar12 & 0xffffffff] = rp[uVar13];
        rp[uVar13] = iVar14;
        iVar14 = A->row_stride;
        if (0 < (long)iVar14) {
          uVar10 = (int)uVar11 * iVar14;
          lVar5 = iVar14 * lVar4;
          lVar8 = 0;
          do {
            mVar1 = *(m2v_base *)((long)pmVar2 + lVar8 * 4 + lVar5);
            *(m2v_base *)((long)pmVar2 + lVar8 * 4 + lVar5) = pmVar2[(ulong)uVar10 + lVar8];
            pmVar2[(ulong)uVar10 + lVar8] = mVar1;
            lVar8 = lVar8 + 1;
          } while (lVar8 < A->row_stride);
        }
      }
      if (uVar13 != uVar7) {
        iVar14 = cp[uVar7];
        cp[uVar7] = cp[uVar13];
        cp[uVar13] = iVar14;
        m2v_swap_cols(A,(int)uVar7,c2);
      }
      uVar7 = uVar13 + 1;
      if ((long)uVar7 < (long)A->n_row) {
        uVar9 = uVar7 & 0xffffffff;
        do {
          iVar14 = (int)uVar9;
          m2v_multadd_row_from
                    (A,c2,c2 + 1,
                     (uint)((A->e[(int)(A->row_stride * iVar14 + ((uint)(uVar13 >> 5) & 0x7ffffff))]
                             >> (c2 & 0x1f) & 1) != 0),A,iVar14);
          uVar9 = (ulong)(iVar14 + 1U);
        } while ((int)(iVar14 + 1U) < A->n_row);
      }
      if (!bVar3) break;
      uVar9 = (ulong)A->n_col;
      lVar4 = lVar4 + 4;
      uVar13 = uVar7;
      if ((long)uVar9 <= (long)uVar7) break;
    }
  }
LAB_00101fed:
  return (int)uVar13;
code_r0x00101ec9:
  uVar6 = (int)uVar7 + 1;
  uVar7 = (ulong)uVar6;
  uVar9 = uVar9 + 1;
  bVar3 = (int)uVar6 < (int)uVar10;
  if (uVar6 == uVar10) goto LAB_00101fed;
  goto LAB_00101e9e;
}

Assistant:

int MV_GEN_N(_LU_decomp_inplace)(MV_GEN_TYPE* A,
				int* rp,
				int* cp)
{
	/* Initialize permutations */
	int i;
	for (i = 0; i < A->n_row; ++i)
		rp[i] = i;
	for (i = 0; i < A->n_col; ++i)
		cp[i] = i;

	/* LU decomposition */
	for (i = 0; i < A->n_col && i < A->n_row; ++i) {
		/* Find a pivot
		 *
		 * We must pick in A to process that does not lead to a
		 * zero value on the diagonal of U, for otherwise we
		 * can't keep processing.
		 *
		 * Find a row such that the resulting U[i,i]
		 * will be nonzero.
		 */
		int prow;
		int pcol;
		for (pcol = i; pcol < A->n_col; ++pcol) {
			for (prow = i; prow < A->n_row; ++prow) {
				if (MV_GEN_N(_get_el)(A, prow, pcol) != 0) {
					goto pivot_found;
				}
			}
		}

		/* No pivot found; maximum rank reached */
		assert (pcol == A->n_col);
		break;
pivot_found:

		/* Permute row and column to get pivot into place,
		   and record */
		if (prow != i) {
			SwapInt(rp[i], rp[prow]);
			MV_GEN_N(_swap_rows)(A, i, prow);
		}
		if (pcol != i) {
			SwapInt(cp[i], cp[pcol]);
			MV_GEN_N(_swap_cols)(A, pcol, i);
		}

		/* At this point, the row i of U is computed correctly
		 * already, due to the updates to a (see below, "update
		 * A in the undecomposed part").  The column i of L is
		 * not quite correct yet; we need to divide the entries
		 * by Uii.
		 */

		/* Compute the column i of L */
		MV_GEN_ELTYPE Uii_inv = finv(MV_GEN_N(_get_el)(A, i, i));
		MV_GEN_N(_mult_col_from)(A, i, i + 1, Uii_inv);

		/* Update A in the yet undecomposed part */
		for (int j = i + 1; j < A->n_row; ++j) {
			const MV_GEN_ELTYPE Lji = MV_GEN_N(_get_el)(A, j, i);
			MV_GEN_N(_multadd_row_from)(A, i, i + 1, Lji, A, j);
		}
	}

	/* At this point, i is the rank of the matrix */
	return i;
}